

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locale.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
fmt::v5::internal::vformat<char>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,locale *loc,basic_string_view<char> format_str,
          basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          args)

{
  locale_ref local_250;
  undefined **local_248;
  undefined1 *local_240;
  long lStack_238;
  undefined8 local_230;
  undefined1 local_228 [504];
  
  lStack_238 = 0;
  local_248 = &PTR_grow_00182020;
  local_230 = 500;
  local_240 = local_228;
  locale_ref::locale_ref<std::locale>(&local_250,loc);
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str,args,local_250);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_240,local_240 + lStack_238);
  local_248 = &PTR_grow_00182020;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<Char> vformat(
    const std::locale &loc, basic_string_view<Char> format_str,
    basic_format_args<typename buffer_context<Char>::type> args) {
  basic_memory_buffer<Char> buffer;
  internal::vformat_to(loc, buffer, format_str, args);
  return fmt::to_string(buffer);
}